

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.h
# Opt level: O0

WallDuration * __thiscall
miniros::DurationBase<miniros::WallDuration>::operator-=
          (DurationBase<miniros::WallDuration> *this,WallDuration *rhs)

{
  WallDuration *in_RDI;
  DurationBase<miniros::WallDuration> *in_stack_00000008;
  WallDuration *in_stack_ffffffffffffffd8;
  DurationBase<miniros::WallDuration> *in_stack_ffffffffffffffe0;
  
  operator-(in_stack_00000008);
  operator+=(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  WallDuration::~WallDuration((WallDuration *)0x55c1f5);
  return in_RDI;
}

Assistant:

T& DurationBase<T>::operator-=(const T &rhs)
  {
    *this += (-rhs);
    return *static_cast<T*>(this);
  }